

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string message;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  pointer local_28;
  
  if (this->MessageNever == false) {
    if (copy) {
      local_40._M_str = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_00495447;
      local_40._M_str = "Up-to-date: ";
    }
    local_28 = (toFile->_M_dataplus)._M_p;
    local_30 = toFile->_M_string_length;
    local_40._M_len = 0xc;
    views._M_len = 2;
    views._M_array = &local_40;
    cmCatViews_abi_cxx11_(&local_60,views);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,&local_60,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00495447:
  if (type != TypeDir) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message =
      cmStrCat((copy ? "Installing: " : "Up-to-date: "), toFile);
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}